

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::handleCharacter(Tokenizer *this,char ch)

{
  bool bVar1;
  logic_error *this_00;
  
  switch(this->state) {
  case st_top:
    inTop(this,ch);
    return;
  case st_in_hexstring:
    goto switchD_001e3348_caseD_1;
  case st_in_hexstring_2nd:
    inHexstring2nd(this,ch);
    return;
  case st_name:
    inName(this,ch);
    return;
  case st_literal:
    goto switchD_001e3348_caseD_5;
  case st_in_space:
    if (((uint)(int)ch < 0x21) && ((0x100003e01U >> ((ulong)(uint)(int)ch & 0x3f) & 1) != 0)) {
      return;
    }
    this->type = tt_space;
    break;
  case st_in_comment:
    if ((ch != '\r') && (ch != '\n')) {
      return;
    }
    if (this->include_ignorable != true) {
      this->state = st_before_token;
      return;
    }
    this->type = tt_comment;
    break;
  case st_string_escape:
    inStringEscape(this,ch);
    return;
  case st_char_code:
    inCharCode(this,ch);
    return;
  case st_string_after_cr:
    this->state = st_in_string;
    if (ch == '\n') {
      return;
    }
  case st_in_string:
    inString(this,ch);
    return;
  case st_lt:
    if (ch == '<') {
      this->type = tt_dict_open;
      goto LAB_001e34bd;
    }
    this->state = st_in_hexstring;
    goto switchD_001e3348_caseD_1;
  case st_gt:
    inGt(this,ch);
    return;
  case st_inline_image:
    if ((this->raw_val)._M_string_length + 1 != this->inline_image_bytes) {
      return;
    }
    this->type = tt_inline_image;
    this->inline_image_bytes = 0;
    goto LAB_001e34bd;
  case st_sign:
    if ((byte)(ch - 0x30U) < 10) {
      this->state = st_number;
      return;
    }
    if (ch == '.') {
      this->state = st_decimal;
      return;
    }
    goto LAB_001e3532;
  case st_number:
    inNumber(this,ch);
    return;
  case st_real:
    if ((byte)(ch - 0x30U) < 10) {
      return;
    }
    bVar1 = isDelimiter(this,ch);
    if (bVar1) {
      this->type = tt_real;
      this->state = st_token_ready;
      this->in_token = false;
      this->char_to_unread = ch;
      return;
    }
    this->state = st_literal;
    return;
  case st_decimal:
    if ((byte)(ch - 0x30U) < 10) {
      this->state = st_real;
      return;
    }
LAB_001e3532:
    this->state = st_literal;
switchD_001e3348_caseD_5:
    inLiteral(this,ch);
    return;
  case st_name_hex1:
    inNameHex1(this,ch);
    return;
  case st_name_hex2:
    inNameHex2(this,ch);
    return;
  case st_before_token:
    inBeforeToken(this,ch);
    return;
  case st_token_ready:
    inTokenReady(this,'\0');
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"INTERNAL ERROR: invalid state while reading token");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this->in_token = false;
  this->char_to_unread = ch;
LAB_001e34bd:
  this->state = st_token_ready;
  return;
switchD_001e3348_caseD_1:
  inHexstring(this,ch);
  return;
}

Assistant:

void
Tokenizer::handleCharacter(char ch)
{
    // In some cases, functions called below may call a second handler. This happens whenever you
    // have to use a character from the next token to detect the end of the current token.

    switch (state) {
    case st_top:
        inTop(ch);
        return;

    case st_in_space:
        inSpace(ch);
        return;

    case st_in_comment:
        inComment(ch);
        return;

    case st_lt:
        inLt(ch);
        return;

    case st_gt:
        inGt(ch);
        return;

    case st_in_string:
        inString(ch);
        return;

    case st_name:
        inName(ch);
        return;

    case st_number:
        inNumber(ch);
        return;

    case st_real:
        inReal(ch);
        return;

    case st_string_after_cr:
        inStringAfterCR(ch);
        return;

    case st_string_escape:
        inStringEscape(ch);
        return;

    case st_char_code:
        inCharCode(ch);
        return;

    case st_literal:
        inLiteral(ch);
        return;

    case st_inline_image:
        inInlineImage(ch);
        return;

    case st_in_hexstring:
        inHexstring(ch);
        return;

    case st_in_hexstring_2nd:
        inHexstring2nd(ch);
        return;

    case st_name_hex1:
        inNameHex1(ch);
        return;

    case st_name_hex2:
        inNameHex2(ch);
        return;

    case st_sign:
        inSign(ch);
        return;

    case st_decimal:
        inDecimal(ch);
        return;

    case (st_before_token):
        inBeforeToken(ch);
        return;

    case (st_token_ready):
        inTokenReady(ch);
        return;

    default:
        throw std::logic_error("INTERNAL ERROR: invalid state while reading token");
    }
}